

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseExternalID(xmlParserCtxtPtr ctxt,xmlChar **publicID,int strict)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *local_30;
  xmlChar *URI;
  int strict_local;
  xmlChar **publicID_local;
  xmlParserCtxtPtr ctxt_local;
  
  local_30 = (xmlChar *)0x0;
  *publicID = (xmlChar *)0x0;
  if ((((*ctxt->input->cur == 'S') && (ctxt->input->cur[1] == 'Y')) && (ctxt->input->cur[2] == 'S'))
     && (((ctxt->input->cur[3] == 'T' && (ctxt->input->cur[4] == 'E')) &&
         (ctxt->input->cur[5] == 'M')))) {
    ctxt->input->cur = ctxt->input->cur + 6;
    ctxt->input->col = ctxt->input->col + 6;
    if (*ctxt->input->cur == '\0') {
      xmlParserGrow(ctxt);
    }
    iVar1 = xmlSkipBlankChars(ctxt);
    if (iVar1 == 0) {
      xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after \'SYSTEM\'\n");
    }
    local_30 = xmlParseSystemLiteral(ctxt);
    if (local_30 == (xmlChar *)0x0) {
      xmlFatalErr(ctxt,XML_ERR_URI_REQUIRED,(char *)0x0);
    }
  }
  else if (((*ctxt->input->cur == 'P') && (ctxt->input->cur[1] == 'U')) &&
          ((ctxt->input->cur[2] == 'B' &&
           (((ctxt->input->cur[3] == 'L' && (ctxt->input->cur[4] == 'I')) &&
            (ctxt->input->cur[5] == 'C')))))) {
    ctxt->input->cur = ctxt->input->cur + 6;
    ctxt->input->col = ctxt->input->col + 6;
    if (*ctxt->input->cur == '\0') {
      xmlParserGrow(ctxt);
    }
    iVar1 = xmlSkipBlankChars(ctxt);
    if (iVar1 == 0) {
      xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after \'PUBLIC\'\n");
    }
    pxVar2 = xmlParsePubidLiteral(ctxt);
    *publicID = pxVar2;
    if (*publicID == (xmlChar *)0x0) {
      xmlFatalErr(ctxt,XML_ERR_PUBID_REQUIRED,(char *)0x0);
    }
    if (strict == 0) {
      iVar1 = xmlSkipBlankChars(ctxt);
      if (iVar1 == 0) {
        return (xmlChar *)0x0;
      }
      if ((*ctxt->input->cur != '\'') && (*ctxt->input->cur != '\"')) {
        return (xmlChar *)0x0;
      }
    }
    else {
      iVar1 = xmlSkipBlankChars(ctxt);
      if (iVar1 == 0) {
        xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after the Public Identifier\n");
      }
    }
    local_30 = xmlParseSystemLiteral(ctxt);
    if (local_30 == (xmlChar *)0x0) {
      xmlFatalErr(ctxt,XML_ERR_URI_REQUIRED,(char *)0x0);
    }
  }
  return local_30;
}

Assistant:

xmlChar *
xmlParseExternalID(xmlParserCtxtPtr ctxt, xmlChar **publicID, int strict) {
    xmlChar *URI = NULL;

    *publicID = NULL;
    if (CMP6(CUR_PTR, 'S', 'Y', 'S', 'T', 'E', 'M')) {
        SKIP(6);
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
	                   "Space required after 'SYSTEM'\n");
	}
	URI = xmlParseSystemLiteral(ctxt);
	if (URI == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_URI_REQUIRED, NULL);
        }
    } else if (CMP6(CUR_PTR, 'P', 'U', 'B', 'L', 'I', 'C')) {
        SKIP(6);
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		    "Space required after 'PUBLIC'\n");
	}
	*publicID = xmlParsePubidLiteral(ctxt);
	if (*publicID == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_PUBID_REQUIRED, NULL);
	}
	if (strict) {
	    /*
	     * We don't handle [83] so "S SystemLiteral" is required.
	     */
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			"Space required after the Public Identifier\n");
	    }
	} else {
	    /*
	     * We handle [83] so we return immediately, if
	     * "S SystemLiteral" is not detected. We skip blanks if no
             * system literal was found, but this is harmless since we must
             * be at the end of a NotationDecl.
	     */
	    if (SKIP_BLANKS == 0) return(NULL);
	    if ((CUR != '\'') && (CUR != '"')) return(NULL);
	}
	URI = xmlParseSystemLiteral(ctxt);
	if (URI == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_URI_REQUIRED, NULL);
        }
    }
    return(URI);
}